

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForbiddenPointFinder.cpp
# Opt level: O1

bool __thiscall
ForbiddenPointFinder::isFour(ForbiddenPointFinder *this,int x,int y,int nColor,int nDir)

{
  Stone SVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  Stone *pSVar6;
  Stone (*paSVar7) [17];
  int iVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  Stone SVar15;
  Stone *pSVar16;
  
  lVar4 = (long)x;
  if ((this->cBoard[lVar4 + 1][(long)y + 1] == Empty) && (bVar2 = isFive(this,x,y,nColor), !bVar2))
  {
    if (nColor == 1) {
      SVar15 = White;
LAB_001033d3:
      pSVar16 = this->cBoard[lVar4 + 1] + (long)y + 1;
      *pSVar16 = SVar15;
      if (nDir - 1U < 4) {
        iVar14 = x + 1;
        iVar10 = y + 1;
        switch(nDir) {
        case 1:
          uVar11 = x;
          if (0 < x) {
            do {
              SVar1 = this->cBoard[uVar11][(long)y + 1];
              if (SVar1 != SVar15) {
                if (SVar1 == Empty) {
                  bVar2 = isFive(this,uVar11 - 1,y,0,1);
                  bVar3 = true;
                  if (bVar2) goto LAB_00103802;
                }
                break;
              }
              bVar2 = 1 < (int)uVar11;
              uVar11 = uVar11 - 1;
            } while (bVar2);
          }
          if (x < 0xe) {
            lVar4 = (long)(x + 2);
            pSVar6 = this->cBoard[lVar4] + (long)y + 1;
LAB_001035c8:
            x = x + 1;
            lVar4 = lVar4 + 1;
            if (*pSVar6 == SVar15) goto code_r0x001035d3;
            if (*pSVar6 == Empty) {
              iVar8 = 1;
LAB_001037f3:
              bVar2 = isFive(this,x,y,0,iVar8);
              bVar3 = true;
              if (bVar2) goto LAB_00103802;
            }
            break;
          }
          break;
        case 2:
          if (0 < y) {
            uVar9 = (ulong)(uint)y;
            do {
              iVar14 = (int)uVar9;
              SVar1 = this->cBoard[lVar4 + 1][uVar9];
              if (SVar1 != SVar15) {
                if (SVar1 == Empty) {
                  bVar2 = isFive(this,x,iVar14 + -1,0,2);
                  bVar3 = true;
                  if (bVar2) goto LAB_00103802;
                }
                break;
              }
              uVar9 = (ulong)(iVar14 - 1);
            } while (1 < iVar14);
          }
          if (y < 0xe) {
            lVar5 = (long)(y + 2) + 0x1c5;
            do {
              SVar1 = *(Stone *)((long)this->ptForbidden + lVar5 * 4 + lVar4 * 0x44 + 0x38);
              if (SVar1 != SVar15) {
                if (SVar1 == Empty) {
                  iVar8 = 2;
                  y = iVar10;
                  goto LAB_001037f3;
                }
                break;
              }
              iVar10 = iVar10 + 1;
              iVar14 = (int)lVar5;
              lVar5 = lVar5 + 1;
            } while (iVar14 != 0x1d4);
          }
          break;
        case 3:
          if (0 < y && 0 < x) {
            uVar9 = (ulong)(uint)y;
            uVar13 = (ulong)(uint)x;
            do {
              iVar12 = (int)uVar13;
              iVar8 = (int)uVar9;
              SVar1 = this->cBoard[uVar13][uVar9];
              if (SVar1 != SVar15) {
                if (SVar1 == Empty) {
                  bVar2 = isFive(this,iVar12 + -1,iVar8 + -1,0,3);
                  bVar3 = true;
                  if (bVar2) goto LAB_00103802;
                }
                break;
              }
              if (iVar12 < 2) break;
              uVar13 = (ulong)(iVar12 - 1);
              uVar9 = (ulong)(iVar8 - 1);
            } while (1 < iVar8);
          }
          if (y < 0xe && x < 0xe) {
            lVar5 = (long)(x + 2);
            pSVar6 = this->cBoard[lVar5] + (y + 2);
            lVar4 = (long)(y + 2);
            do {
              if (*pSVar6 != SVar15) {
                if (*pSVar6 == Empty) {
                  iVar8 = 3;
                  y = iVar10;
                  x = iVar14;
                  goto LAB_001037f3;
                }
                break;
              }
              if (0xe < lVar5) break;
              lVar5 = lVar5 + 1;
              iVar14 = iVar14 + 1;
              pSVar6 = pSVar6 + 0x12;
              iVar10 = iVar10 + 1;
              bVar2 = lVar4 < 0xf;
              lVar4 = lVar4 + 1;
            } while (bVar2);
          }
          break;
        case 4:
          if (y < 0xe && 0 < x) {
            lVar4 = 0;
            uVar9 = (ulong)(uint)x;
            do {
              SVar1 = this->cBoard[uVar9][(y + 2) + lVar4];
              if (SVar1 != SVar15) {
                if (SVar1 == Empty) {
                  bVar2 = isFive(this,~(uint)lVar4 + x,y + 1 + (uint)lVar4,0,4);
                  bVar3 = true;
                  if (bVar2) goto LAB_00103802;
                }
                break;
              }
              if ((int)uVar9 < 2) break;
              lVar5 = (y + 2) + lVar4;
              uVar9 = (ulong)((int)uVar9 - 1);
              lVar4 = lVar4 + 1;
            } while (lVar5 < 0xf);
          }
          if (0 < y && x < 0xe) {
            lVar4 = (long)(x + 2);
            paSVar7 = this->cBoard + lVar4;
            do {
              if ((*paSVar7)[(uint)y] != SVar15) {
                if ((*paSVar7)[(uint)y] == Empty) {
                  iVar8 = 4;
                  y = y - 1;
                  x = iVar14;
                  goto LAB_001037f3;
                }
                break;
              }
              if (0xe < lVar4) break;
              lVar4 = lVar4 + 1;
              iVar14 = iVar14 + 1;
              paSVar7 = paSVar7 + 1;
              bVar2 = 1 < y;
              y = y - 1;
            } while (bVar2);
          }
        }
      }
LAB_00103800:
      bVar3 = false;
LAB_00103802:
      *pSVar16 = Empty;
      return bVar3;
    }
    if (nColor == 0) {
      bVar2 = isOverline(this,x,y);
      SVar15 = Black;
      if (!bVar2) goto LAB_001033d3;
    }
  }
  return false;
code_r0x001035d3:
  pSVar6 = pSVar6 + 0x11;
  if ((int)lVar4 == 0x10) goto LAB_00103800;
  goto LAB_001035c8;
}

Assistant:

bool ForbiddenPointFinder::isFour(int x, int y, int nColor, int nDir) {
    if (cBoard[x + 1][y + 1] != Stone::Empty)
        return false;

    if (isFive(x, y, nColor))    // five?
        return false;
    else if ((nColor == 0) && (isOverline(x, y)))    // black overline?
        return false;
    else {
        Stone c;
        if (nColor == 0)    // black
            c = Stone::Black;
        else if (nColor == 1)    // white
            c = Stone::White;
        else
            return false;

        setStone(x, y, c);

        int i, j;

        switch (nDir) {
            case 1:        // horizontal direction
                i = x;
                while (i > 0) {
                    if (cBoard[i][y + 1] == c) {
                        i--;
                        continue;
                    } else if (cBoard[i][y + 1] == Stone::Empty) {
                        if (isFive(i - 1, y, 0, nDir)) {
                            setStone(x, y, Stone::Empty);
                            return true;
                        } else
                            break;
                    } else
                        break;
                }
                i = x + 2;
                while (i < (BoardSize + 1)) {
                    if (cBoard[i][y + 1] == c) {
                        i++;
                        continue;
                    } else if (cBoard[i][y + 1] == Stone::Empty) {
                        if (isFive(i - 1, y, 0, nDir)) {
                            setStone(x, y, Stone::Empty);
                            return true;
                        } else
                            break;
                    } else
                        break;
                }
                setStone(x, y, Stone::Empty);
                return false;
                break;
            case 2:        // vertial direction
                i = y;
                while (i > 0) {
                    if (cBoard[x + 1][i] == c) {
                        i--;
                        continue;
                    } else if (cBoard[x + 1][i] == Stone::Empty) {
                        if (isFive(x, i - 1, 0, nDir)) {
                            setStone(x, y, Stone::Empty);
                            return true;
                        } else
                            break;
                    } else
                        break;
                }
                i = y + 2;
                while (i < (BoardSize + 1)) {
                    if (cBoard[x + 1][i] == c) {
                        i++;
                        continue;
                    } else if (cBoard[x + 1][i] == Stone::Empty) {
                        if (isFive(x, i - 1, 0, nDir)) {
                            setStone(x, y, Stone::Empty);
                            return true;
                        } else
                            break;
                    } else
                        break;
                }
                setStone(x, y, Stone::Empty);
                return false;
                break;
            case 3:        // diagonal direction - '/'
                i = x;
                j = y;
                while ((i > 0) && (j > 0)) {
                    if (cBoard[i][j] == c) {
                        i--;
                        j--;
                        continue;
                    } else if (cBoard[i][j] == Stone::Empty) {
                        if (isFive(i - 1, j - 1, 0, nDir)) {
                            setStone(x, y, Stone::Empty);
                            return true;
                        } else
                            break;
                    } else
                        break;
                }
                i = x + 2;
                j = y + 2;
                while ((i < (BoardSize + 1)) && (j < (BoardSize + 1))) {
                    if (cBoard[i][j] == c) {
                        i++;
                        j++;
                        continue;
                    } else if (cBoard[i][j] == Stone::Empty) {
                        if (isFive(i - 1, j - 1, 0, nDir)) {
                            setStone(x, y, Stone::Empty);
                            return true;
                        } else
                            break;
                    } else
                        break;
                }
                setStone(x, y, Stone::Empty);
                return false;
                break;
            case 4:        // diagonal direction - '\'
                i = x;
                j = y + 2;
                while ((i > 0) && (j < (BoardSize + 1))) {
                    if (cBoard[i][j] == c) {
                        i--;
                        j++;
                        continue;
                    } else if (cBoard[i][j] == Stone::Empty) {
                        if (isFive(i - 1, j - 1, 0, nDir)) {
                            setStone(x, y, Stone::Empty);
                            return true;
                        } else
                            break;
                    } else
                        break;
                }
                i = x + 2;
                j = y;
                while ((i < (BoardSize + 1)) && (j > 0)) {
                    if (cBoard[i][j] == c) {
                        i++;
                        j--;
                        continue;
                    } else if (cBoard[i][j] == Stone::Empty) {
                        if (isFive(i - 1, j - 1, 0, nDir)) {
                            setStone(x, y, Stone::Empty);
                            return true;
                        } else
                            break;
                    } else
                        break;
                }
                setStone(x, y, Stone::Empty);
                return false;
                break;
            default:
                setStone(x, y, Stone::Empty);
                return false;
                break;
        }
    }
}